

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall
sysapi::epoll_registration::epoll_registration(epoll_registration *this,epoll_registration *rhs)

{
  _Manager_type *pp_Var1;
  undefined8 uVar2;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  this->ep = rhs->ep;
  this->fd = rhs->fd;
  this->events = rhs->events;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (rhs->callback)._M_invoker;
  if ((rhs->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    pp_Var1 = &(rhs->callback).super__Function_base._M_manager;
    uVar2 = *(undefined8 *)((long)&(rhs->callback).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->callback).super__Function_base._M_functor =
         *(undefined8 *)&(rhs->callback).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = uVar2;
    (this->callback).super__Function_base._M_manager = *pp_Var1;
    *pp_Var1 = (_Manager_type)0x0;
    (rhs->callback)._M_invoker = (_Invoker_type)0x0;
  }
  if (this->ep != (epoll *)0x0) {
    epoll::modify(this->ep,this->fd,this->events,this);
  }
  rhs->ep = (epoll *)0x0;
  rhs->fd = -1;
  rhs->events = 0;
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  std::function<void_(unsigned_int)>::operator=
            (&rhs->callback,(function<void_(unsigned_int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

epoll_registration::epoll_registration(epoll_registration&& rhs)
    : ep(rhs.ep)
    , fd(rhs.fd)
    , events(rhs.events)
    , callback(std::move(rhs.callback))
{
    update();
    rhs.ep = nullptr;
    rhs.fd = -1;
    rhs.events = 0;
    rhs.callback = callback_t();
}